

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkaccessbackend.cpp
# Opt level: O0

void __thiscall
QNetworkAccessBackendFactory::~QNetworkAccessBackendFactory(QNetworkAccessBackendFactory *this)

{
  long lVar1;
  bool bVar2;
  QObject *in_RDI;
  long in_FS_OFFSET;
  QNetworkAccessBackendFactory **in_stack_ffffffffffffffd8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  *(undefined ***)in_RDI = &PTR_metaObject_00499bc8;
  bVar2 = QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_factoryData>_>::exists
                    ((QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_factoryData>_>
                      *)0x1895af);
  if (bVar2) {
    QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_factoryData>_>::operator->
              ((QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_factoryData>_> *)
               0x1895c1);
    QList<QNetworkAccessBackendFactory*>::removeAll<QNetworkAccessBackendFactory*>
              ((QList<QNetworkAccessBackendFactory_*> *)in_RDI,in_stack_ffffffffffffffd8);
  }
  QObject::~QObject(in_RDI);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

QNetworkAccessBackendFactory::~QNetworkAccessBackendFactory()
{
    if (factoryData.exists())
        factoryData->removeAll(this);
}